

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

void Ivy_FastMapPerform(Ivy_Man_t *pAig,int nLimit,int fRecovery,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  int *__s;
  void *pvVar4;
  Vec_Vec_t *pVVar5;
  abctime aVar6;
  Ivy_Obj_t *pIVar7;
  abctime aVar8;
  abctime clkTotal;
  abctime clk;
  int Area;
  int Delay;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_SuppMan_t *pMan;
  int fVerbose_local;
  int fRecovery_local;
  int nLimit_local;
  Ivy_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  __s = (int *)malloc(0x20);
  memset(__s,0,0x20);
  *__s = nLimit;
  iVar1 = Ivy_ManObjIdMax(pAig);
  __s[1] = iVar1 + 1;
  __s[2] = nLimit * 4 + 0xc;
  pvVar4 = malloc((long)(__s[1] * __s[2]));
  *(void **)(__s + 4) = pvVar4;
  memset(*(void **)(__s + 4),0,(long)(__s[1] * __s[2]));
  pVVar5 = Vec_VecAlloc(100);
  *(Vec_Vec_t **)(__s + 6) = pVVar5;
  pAig->pData = __s;
  aVar6 = Abc_Clock();
  pIVar7 = Ivy_ManConst1(pAig);
  Ivy_ObjSuppStart(pAig,pIVar7);
  for (Area = 0; iVar1 = Vec_PtrSize(pAig->vPis), Area < iVar1; Area = Area + 1) {
    pIVar7 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPis,Area);
    Ivy_ObjSuppStart(pAig,pIVar7);
  }
  for (Area = 0; iVar1 = Vec_PtrSize(pAig->vObjs), Area < iVar1; Area = Area + 1) {
    pIVar7 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,Area);
    if ((pIVar7 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pIVar7), iVar1 != 0)) {
      Ivy_FastMapNode(pAig,pIVar7,nLimit);
    }
  }
  iVar1 = Ivy_FastMapDelay(pAig);
  iVar2 = Ivy_FastMapArea(pAig);
  if (fVerbose != 0) {
    aVar8 = Abc_Clock();
    Ivy_FastMapPrint(pAig,iVar1,iVar2,aVar8 - aVar6,"Delay oriented mapping: ");
  }
  if (fRecovery != 0) {
    aVar6 = Abc_Clock();
    Ivy_FastMapRequired(pAig,iVar1,0);
    Ivy_FastMapRecover(pAig,nLimit);
    iVar1 = Ivy_FastMapDelay(pAig);
    iVar2 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar8 = Abc_Clock();
      Ivy_FastMapPrint(pAig,iVar1,iVar2,aVar8 - aVar6,"Area recovery 2       : ");
    }
    aVar6 = Abc_Clock();
    Ivy_FastMapRequired(pAig,iVar1,0);
    for (Area = 0; iVar1 = Vec_PtrSize(pAig->vObjs), Area < iVar1; Area = Area + 1) {
      pIVar7 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,Area);
      if ((pIVar7 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pIVar7), iVar1 != 0)) {
        Ivy_FastMapNodeArea(pAig,pIVar7,nLimit);
      }
    }
    iVar1 = Ivy_FastMapDelay(pAig);
    iVar2 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar8 = Abc_Clock();
      Ivy_FastMapPrint(pAig,iVar1,iVar2,aVar8 - aVar6,"Area recovery 1       : ");
    }
    aVar6 = Abc_Clock();
    Ivy_FastMapRequired(pAig,iVar1,0);
    Ivy_FastMapRecover(pAig,nLimit);
    iVar1 = Ivy_FastMapDelay(pAig);
    iVar2 = Ivy_FastMapArea(pAig);
    if (fVerbose != 0) {
      aVar8 = Abc_Clock();
      Ivy_FastMapPrint(pAig,iVar1,iVar2,aVar8 - aVar6,"Area recovery 2       : ");
    }
  }
  aVar6 = Abc_Clock();
  s_MappingTime = aVar6 - aVar3;
  s_MappingMem = __s[1] * __s[2];
  return;
}

Assistant:

void Ivy_FastMapPerform( Ivy_Man_t * pAig, int nLimit, int fRecovery, int fVerbose )
{
    Ivy_SuppMan_t * pMan;
    Ivy_Obj_t * pObj;
    int i, Delay, Area;
    abctime clk, clkTotal = Abc_Clock();
    // start the memory for supports
    pMan = ABC_ALLOC( Ivy_SuppMan_t, 1 );
    memset( pMan, 0, sizeof(Ivy_SuppMan_t) );
    pMan->nLimit = nLimit;
    pMan->nObjs  = Ivy_ManObjIdMax(pAig) + 1;
    pMan->nSize  = sizeof(Ivy_Supp_t) + nLimit * sizeof(int);
    pMan->pMem   = (char *)ABC_ALLOC( char, pMan->nObjs * pMan->nSize );
    memset( pMan->pMem, 0, pMan->nObjs * pMan->nSize );
    pMan->vLuts  = Vec_VecAlloc( 100 );
    pAig->pData  = pMan;
clk = Abc_Clock();
    // set the PI mapping
    Ivy_ObjSuppStart( pAig, Ivy_ManConst1(pAig) );
    Ivy_ManForEachPi( pAig, pObj, i )
        Ivy_ObjSuppStart( pAig, pObj );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNode( pAig, pObj, nLimit );
    // find the best arrival time and area
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Delay oriented mapping: " );

// 2-1-2 (doing 2-1-2-1-2 improves 0.5%)

    if ( fRecovery )
    {
clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNodeArea( pAig, pObj, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 1       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );
    }


    s_MappingTime = Abc_Clock() - clkTotal;
    s_MappingMem = pMan->nObjs * pMan->nSize;
/*
    {
        Vec_Ptr_t * vNodes;
        vNodes = Vec_PtrAlloc( 100 );
        Vec_VecForEachEntry( Ivy_Obj_t *, pMan->vLuts, pObj, i, k )
            Vec_PtrPush( vNodes, pObj );
        Ivy_ManShow( pAig, 0, vNodes );
        Vec_PtrFree( vNodes );
    }
*/
}